

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

float mpack_node_float_strict(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_float) {
      node_local.tree._4_4_ = ((node.data)->value).f;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree._4_4_ = 0.0;
    }
  }
  else {
    node_local.tree._4_4_ = 0.0;
  }
  return node_local.tree._4_4_;
}

Assistant:

MPACK_INLINE float mpack_node_float_strict(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_float)
        return node.data->value.f;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}